

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmFormatter::write_tab(CVmFormatter *this,int indent,int multiple)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long *plVar4;
  wchar_t in_EDX;
  wchar_t in_ESI;
  long *in_RDI;
  char buf [40];
  int maxcol;
  undefined4 in_stack_ffffffffffffff98;
  CVmFormatter *this_00;
  wchar_t local_10;
  wchar_t local_c;
  
  if ((*(ushort *)((long)in_RDI + 0xef81) >> 6 & 1) == 0) {
    if (in_EDX == L'\0') {
      if (in_ESI != L'\0') {
        local_c = in_ESI;
        iVar2 = (**(code **)(*in_RDI + 0x70))();
        while( true ) {
          bVar1 = false;
          if (local_c != L'\0') {
            bVar1 = *(int *)((long)in_RDI + 0x1c) < iVar2;
          }
          if (!bVar1) break;
          *(undefined4 *)((long)in_RDI + (long)(int)in_RDI[3] * 4 + 0x28) = 0x20;
          *(char *)((long)in_RDI + (long)(int)in_RDI[3] + 0xe048) = (char)in_RDI[0x1df0];
          plVar4 = in_RDI + (long)(int)in_RDI[3] * 3 + 0x406;
          *plVar4 = in_RDI[0x1d9e];
          plVar4[1] = in_RDI[0x1d9f];
          plVar4[2] = in_RDI[0x1da0];
          *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
          *(int *)((long)in_RDI + 0x1c) = *(int *)((long)in_RDI + 0x1c) + 1;
          local_c = local_c + L'\xffffffff';
        }
      }
    }
    else {
      local_10 = in_EDX;
      iVar2 = (**(code **)(*in_RDI + 0x70))();
      do {
        if (iVar2 <= *(int *)((long)in_RDI + 0x1c)) {
          return;
        }
        *(undefined4 *)((long)in_RDI + (long)(int)in_RDI[3] * 4 + 0x28) = 0x20;
        *(char *)((long)in_RDI + (long)(int)in_RDI[3] + 0xe048) = (char)in_RDI[0x1df0];
        plVar4 = in_RDI + (long)(int)in_RDI[3] * 3 + 0x406;
        *plVar4 = in_RDI[0x1d9e];
        plVar4[1] = in_RDI[0x1d9f];
        plVar4[2] = in_RDI[0x1da0];
        *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
        *(int *)((long)in_RDI + 0x1c) = *(int *)((long)in_RDI + 0x1c) + 1;
      } while ((*(int *)((long)in_RDI + 0x1c) + 1) % local_10 != 0);
    }
  }
  else {
    this_00 = (CVmFormatter *)&stack0xffffffffffffffb8;
    pcVar3 = "MULTIPLE";
    if (in_ESI != L'\0') {
      pcVar3 = "INDENT";
      in_EDX = in_ESI;
    }
    sprintf((char *)this_00,"<TAB %s=%d>",pcVar3,(ulong)(uint)in_EDX);
    buffer_string(this_00,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffff98));
  }
  return;
}

Assistant:

void CVmFormatter::write_tab(VMG_ int indent, int multiple)
{
    int maxcol;

    /* check to see what the underlying system is expecting */
    if (html_target_)
    {
        char buf[40];

        /* 
         *   the underlying system is HTML - generate an appropriate <TAB>
         *   sequence to produce the desired effect 
         */
        sprintf(buf, "<TAB %s=%d>",
                indent != 0 ? "INDENT" : "MULTIPLE",
                indent != 0 ? indent : multiple);
            
        /* write it out */
        buffer_string(vmg_ buf);
    }
    else if (multiple != 0)
    {
        /* get the maximum column */
        maxcol = get_buffer_maxcol();

        /*
         *   We don't have an HTML target, and we have a tab to an every-N
         *   stop: expand the tab with spaces.  Keep going until we reach
         *   the next tab stop of the given multiple.  
         */
        do
        {
            /* stop if we've reached the maximum column */
            if (linecol_ >= maxcol)
                break;

            /* add another space */
            linebuf_[linepos_] = ' ';
            flagbuf_[linepos_] = cur_flags_;
            colorbuf_[linepos_] = cur_color_;

            /* advance one character in the buffer */
            ++linepos_;

            /* advance the column counter */
            ++linecol_;
        } while ((linecol_ + 1) % multiple != 0);
    }
    else if (indent != 0)
    {
        /* 
         *   We don't have an HTML target, and we just want to add a given
         *   number of spaces.  Simply write out the given number of spaces,
         *   up to our maximum column limit.  
         */
        for (maxcol = get_buffer_maxcol() ;
             indent != 0 && linecol_ < maxcol ; --indent)
        {
            /* add another space */
            linebuf_[linepos_] = ' ';
            flagbuf_[linepos_] = cur_flags_;
            colorbuf_[linepos_] = cur_color_;

            /* advance one character in the buffer and one column */
            ++linepos_;
            ++linecol_;
        }
    }
}